

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O3

RegSlot __thiscall FuncInfo::NextVarRegister(FuncInfo *this)

{
  RegSlot RVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegSlot RVar5;
  
  if (this->firstTmpReg != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0xe0,"(this->firstTmpReg == Js::Constants::NoRegister)",
                       "Shouldn\'t assign var register after we start allocating temp reg");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  RVar1 = this->varRegsCount;
  RVar5 = RVar1 + 1;
  this->varRegsCount = RVar5;
  if (RVar5 != 0) {
    return RVar1;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

Js::RegSlot NextVarRegister()
    {
        AssertMsg(this->firstTmpReg == Js::Constants::NoRegister, "Shouldn't assign var register after we start allocating temp reg");
        Js::RegSlot reg = varRegsCount;
        UInt32Math::Inc(varRegsCount);
        return REGSLOT_TO_VARREG(reg);
    }